

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btCollisionWorldImporter.cpp
# Opt level: O2

btBvhTriangleMeshShape * __thiscall
btCollisionWorldImporter::createBvhTriangleMeshShape
          (btCollisionWorldImporter *this,btStridingMeshInterface *trimesh,btOptimizedBvh *bvh)

{
  btBvhTriangleMeshShape *this_00;
  btVector3 local_38;
  
  this_00 = (btBvhTriangleMeshShape *)btBvhTriangleMeshShape::operator_new(0x68);
  if (bvh == (btOptimizedBvh *)0x0) {
    btBvhTriangleMeshShape::btBvhTriangleMeshShape(this_00,trimesh,true,true);
  }
  else {
    btBvhTriangleMeshShape::btBvhTriangleMeshShape
              (this_00,trimesh,(bvh->super_btQuantizedBvh).m_useQuantization,false);
    local_38.m_floats[0] = 1.0;
    local_38.m_floats[1] = 1.0;
    local_38.m_floats[2] = 1.0;
    local_38.m_floats[3] = 0.0;
    btBvhTriangleMeshShape::setOptimizedBvh(this_00,bvh,&local_38);
  }
  local_38.m_floats._0_8_ = this_00;
  btAlignedObjectArray<btCollisionShape_*>::push_back
            (&this->m_allocatedCollisionShapes,(btCollisionShape **)&local_38);
  return this_00;
}

Assistant:

btBvhTriangleMeshShape* btCollisionWorldImporter::createBvhTriangleMeshShape(btStridingMeshInterface* trimesh, btOptimizedBvh* bvh)
{
	if (bvh)
	{
		btBvhTriangleMeshShape* bvhTriMesh = new btBvhTriangleMeshShape(trimesh,bvh->isQuantized(), false);
		bvhTriMesh->setOptimizedBvh(bvh);
		m_allocatedCollisionShapes.push_back(bvhTriMesh);
		return bvhTriMesh;
	}

	btBvhTriangleMeshShape* ts = new btBvhTriangleMeshShape(trimesh,true);
	m_allocatedCollisionShapes.push_back(ts);
	return ts;

}